

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O1

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  PSH_Hint_conflict pPVar5;
  PSH_Hint_conflict *ppPVar6;
  byte *pbVar7;
  ulong uVar8;
  FT_UInt *pFVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  
  pbVar7 = hint_mask->bytes;
  uVar1 = hint_mask->num_bits;
  uVar2 = table->max_hints;
  if (uVar2 != 0) {
    pFVar9 = &table->hints->flags;
    uVar11 = uVar2;
    do {
      *(byte *)pFVar9 = (byte)*pFVar9 & 0xfb;
      pFVar9[4] = -1;
      pFVar9 = pFVar9 + 0xc;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((ulong)uVar1 == 0) {
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    uVar15 = 0;
    uVar13 = 0;
    uVar11 = 0;
    do {
      if (uVar15 == 0) {
        uVar13 = (uint)*pbVar7;
        pbVar7 = pbVar7 + 1;
        uVar15 = 0x80;
      }
      if ((uVar15 & uVar13) != 0) {
        pPVar5 = table->hints;
        uVar3 = *(uint *)((long)&pPVar5->flags + lVar12);
        if (((uVar3 & 4) == 0) &&
           (*(uint *)((long)&pPVar5->flags + lVar12) = uVar3 | 4, uVar11 < uVar2)) {
          uVar8 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          table->sort[uVar8] = (PSH_Hint_conflict)((long)&pPVar5->org_pos + lVar12);
        }
      }
      uVar15 = uVar15 >> 1;
      lVar12 = lVar12 + 0x30;
    } while ((ulong)uVar1 * 0x30 != lVar12);
  }
  table->num_hints = uVar11;
  if (1 < (int)uVar11) {
    ppPVar6 = table->sort;
    uVar8 = 1;
    uVar10 = 0;
    do {
      pPVar5 = ppPVar6[uVar8];
      iVar4 = pPVar5->org_pos;
      uVar14 = uVar10;
      do {
        if (ppPVar6[uVar14 & 0xffffffff]->org_pos < iVar4) break;
        ppPVar6[uVar14 + 1] = ppPVar6[uVar14 & 0xffffffff];
        ppPVar6[uVar14 & 0xffffffff] = pPVar5;
        lVar12 = uVar14 + 1;
        uVar14 = uVar14 - 1;
      } while (1 < lVar12);
      uVar8 = uVar8 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar11);
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_Int     i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < (FT_Int)count; i1++ )
      {
        hint1 = sort[i1];
        for ( i2 = i1 - 1; i2 >= 0; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }